

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

SPIRType * __thiscall
spirv_cross::CompilerMSL::get_presumed_input_type
          (SPIRType *__return_storage_ptr__,CompilerMSL *this,SPIRType *ib_type,uint32_t index)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  const_iterator cVar3;
  key_type local_30;
  
  pSVar2 = get_physical_member_type(this,ib_type,index);
  SPIRType::SPIRType(__return_storage_ptr__,pSVar2);
  uVar1 = Compiler::get_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,index,
                     DecorationLocation);
  local_30.component =
       Compiler::get_member_decoration
                 ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,index,
                  DecorationComponent);
  local_30.location = uVar1;
  cVar3 = ::std::
          _Rb_tree<spirv_cross::LocationComponentPair,_std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>,_std::_Select1st<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
          ::find(&(this->inputs_by_location)._M_t,&local_30);
  if (((_Rb_tree_header *)cVar3._M_node !=
       &(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header) &&
     (__return_storage_ptr__->vecsize < *(uint *)&cVar3._M_node[1]._M_right)) {
    __return_storage_ptr__->vecsize = *(uint *)&cVar3._M_node[1]._M_right;
  }
  return __return_storage_ptr__;
}

Assistant:

SPIRType CompilerMSL::get_presumed_input_type(const SPIRType &ib_type, uint32_t index) const
{
	SPIRType type = get_physical_member_type(ib_type, index);
	uint32_t loc = get_member_decoration(ib_type.self, index, DecorationLocation);
	uint32_t cmp = get_member_decoration(ib_type.self, index, DecorationComponent);
	auto p_va = inputs_by_location.find({loc, cmp});
	if (p_va != end(inputs_by_location) && p_va->second.vecsize > type.vecsize)
		type.vecsize = p_va->second.vecsize;

	return type;
}